

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

uint64_t sum_quotients<short,short>(random_numerators<short> *vals,short *div)

{
  long lVar1;
  uint uVar2;
  
  if ((ulong)vals->_length != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 + (int)*(short *)((long)vals->_pData + lVar1) / (int)*div;
      lVar1 = lVar1 + 2;
    } while ((ulong)vals->_length * 2 != lVar1);
    return (ulong)(uVar2 & 0xffff);
  }
  return 0;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}